

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_calc_binning(fitsfile *fptr,int naxis,char (*colname) [71],double *minin,double *maxin,
                     double *binsizein,char (*minname) [71],char (*maxname) [71],
                     char (*binname) [71],int *colnum,long *haxes,float *amin,float *amax,
                     float *binsize,int *status)

{
  int local_d0;
  int local_cc;
  int naxis1;
  int i;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  double *binsizein_local;
  double *maxin_local;
  double *minin_local;
  char (*colname_local) [71];
  int naxis_local;
  fitsfile *fptr_local;
  
  fits_calc_binningd(fptr,naxis,colname,minin,maxin,binsizein,minname,maxname,binname,colnum,haxes,
                     amaxd + 3,binsized + 3,(double *)&naxis1,status);
  if (*status == 0) {
    local_d0 = 4;
    if (naxis < 4) {
      local_d0 = naxis;
    }
    for (local_cc = 0; local_cc < local_d0; local_cc = local_cc + 1) {
      amin[local_cc] = (float)amaxd[(long)local_cc + 3];
      amax[local_cc] = (float)binsized[(long)local_cc + 3];
      binsize[local_cc] = (float)*(double *)(&naxis1 + (long)local_cc * 2);
    }
  }
  return *status;
}

Assistant:

int fits_calc_binning(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      long *haxes,     /* O - number of bins in each histogram axis */
      float *amin,     /* O - lower bound of the histogram axes */
      float *amax,     /* O - upper bound of the histogram axes */
      float *binsize,  /* O - width of histogram bins/pixels on each axis */
      int *status)
{
  double amind[4], amaxd[4], binsized[4];

  fits_calc_binningd(fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
		     colnum, haxes, amind, amaxd, binsized, status);

  /* Copy double precision values into single precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amin[i] = (float) amind[i];
      amax[i] = (float) amaxd[i];
      binsize[i] = (float) binsized[i];
    }
  }

  return (*status);
}